

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metaDemuxer.cpp
# Opt level: O0

int __thiscall METADemuxer::readPacket(METADemuxer *this,AVPacket *avPacket)

{
  long lVar1;
  long lVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  size_type sVar6;
  reference pvVar7;
  ssize_t sVar8;
  reference pSVar9;
  void *__buf;
  ContainerToReaderWrapper *local_90;
  int res;
  ContainerToReaderWrapper *cReader;
  StreamInfo *si;
  iterator __end4;
  iterator __begin4;
  vector<StreamInfo,_std::allocator<StreamInfo>_> *__range4;
  StreamInfo *streamInfo;
  int i;
  bool allDataDelayed;
  int64_t minDts;
  int minDtsIndex;
  AVPacket *avPacket_local;
  METADemuxer *this_local;
  
  avPacket->stream_index = 0;
  avPacket->data = (uint8_t *)0x0;
  avPacket->size = 0;
  avPacket->codec = (BaseAbstractStreamReader *)0x0;
  this->m_lastReadRez = 0;
  do {
    minDts._4_4_ = -1;
    _i = 0x7fffffffffffffff;
    bVar3 = true;
    while (bVar3) {
      for (streamInfo._0_4_ = 0;
          sVar6 = std::vector<StreamInfo,_std::allocator<StreamInfo>_>::size(&this->m_codecInfo),
          (int)streamInfo < (int)sVar6; streamInfo._0_4_ = (int)streamInfo + 1) {
        sVar6 = (size_type)(int)streamInfo;
        pvVar7 = std::vector<StreamInfo,_std::allocator<StreamInfo>_>::operator[]
                           (&this->m_codecInfo,sVar6);
        if ((this->m_flushDataMode & 1U) == 0) {
          sVar8 = StreamInfo::read(pvVar7,(int)sVar6,__buf,(size_t)pvVar7);
          pvVar7->lastReadRez = (int)sVar8;
          if (pvVar7->lastReadRez != 4) {
            if (pvVar7->lastReadRez == 2) {
              this->m_lastReadRez = 2;
              return 2;
            }
            if (pvVar7->lastReadRez == 3) {
              if ((pvVar7->m_lastDTS < _i) && ((pvVar7->m_flushed & 1U) == 0)) {
                minDts._4_4_ = (int)streamInfo;
                _i = pvVar7->m_lastDTS;
              }
            }
            else if (pvVar7->m_lastDTS < _i) {
              minDts._4_4_ = (int)streamInfo;
              _i = pvVar7->m_lastDTS;
            }
            goto LAB_002d5bcc;
          }
        }
        else {
          if ((pvVar7->m_lastDTS < _i) && ((pvVar7->m_flushed & 1U) == 0)) {
            minDts._4_4_ = (int)streamInfo;
            _i = pvVar7->m_lastDTS;
          }
LAB_002d5bcc:
          bVar3 = false;
        }
      }
      if (bVar3) {
        __end4 = std::vector<StreamInfo,_std::allocator<StreamInfo>_>::begin(&this->m_codecInfo);
        si = (StreamInfo *)
             std::vector<StreamInfo,_std::allocator<StreamInfo>_>::end(&this->m_codecInfo);
        while (bVar4 = __gnu_cxx::operator!=
                                 (&__end4,(__normal_iterator<StreamInfo_*,_std::vector<StreamInfo,_std::allocator<StreamInfo>_>_>
                                           *)&si), bVar4) {
          pSVar9 = __gnu_cxx::
                   __normal_iterator<StreamInfo_*,_std::vector<StreamInfo,_std::allocator<StreamInfo>_>_>
                   ::operator*(&__end4);
          if (pSVar9->m_dataReader == (AbstractReader *)0x0) {
            local_90 = (ContainerToReaderWrapper *)0x0;
          }
          else {
            local_90 = (ContainerToReaderWrapper *)
                       __dynamic_cast(pSVar9->m_dataReader,&AbstractReader::typeinfo,
                                      &ContainerToReaderWrapper::typeinfo,0);
          }
          if (local_90 != (ContainerToReaderWrapper *)0x0) {
            ContainerToReaderWrapper::resetDelayedMark(local_90);
          }
          __gnu_cxx::
          __normal_iterator<StreamInfo_*,_std::vector<StreamInfo,_std::allocator<StreamInfo>_>_>::
          operator++(&__end4);
        }
      }
    }
    if (minDts._4_4_ != -1) {
      if ((this->m_flushDataMode & 1U) == 0) {
        pvVar7 = std::vector<StreamInfo,_std::allocator<StreamInfo>_>::operator[]
                           (&this->m_codecInfo,(long)minDts._4_4_);
        if (pvVar7->lastReadRez == 3) {
          pvVar7 = std::vector<StreamInfo,_std::allocator<StreamInfo>_>::operator[]
                             (&this->m_codecInfo,(long)minDts._4_4_);
          (*(pvVar7->m_streamReader->super_BaseAbstractStreamReader)._vptr_BaseAbstractStreamReader
            [7])(pvVar7->m_streamReader,avPacket);
          pvVar7 = std::vector<StreamInfo,_std::allocator<StreamInfo>_>::operator[]
                             (&this->m_codecInfo,(long)minDts._4_4_);
          pvVar7->m_flushed = true;
        }
        else {
          pvVar7 = std::vector<StreamInfo,_std::allocator<StreamInfo>_>::operator[]
                             (&this->m_codecInfo,(long)minDts._4_4_);
          iVar5 = (*(pvVar7->m_streamReader->super_BaseAbstractStreamReader).
                    _vptr_BaseAbstractStreamReader[6])(pvVar7->m_streamReader,avPacket);
          pvVar7 = std::vector<StreamInfo,_std::allocator<StreamInfo>_>::operator[]
                             (&this->m_codecInfo,(long)minDts._4_4_);
          pvVar7->m_lastAVRez = iVar5;
        }
        pvVar7 = std::vector<StreamInfo,_std::allocator<StreamInfo>_>::operator[]
                           (&this->m_codecInfo,(long)minDts._4_4_);
        avPacket->dts = pvVar7->m_timeShift + avPacket->dts;
        pvVar7 = std::vector<StreamInfo,_std::allocator<StreamInfo>_>::operator[]
                           (&this->m_codecInfo,(long)minDts._4_4_);
        avPacket->pts = pvVar7->m_timeShift + avPacket->pts;
        lVar1 = avPacket->dts;
        lVar2 = avPacket->duration;
        pvVar7 = std::vector<StreamInfo,_std::allocator<StreamInfo>_>::operator[]
                           (&this->m_codecInfo,(long)minDts._4_4_);
        pvVar7->m_lastDTS = lVar1 + lVar2;
      }
      else {
        pvVar7 = std::vector<StreamInfo,_std::allocator<StreamInfo>_>::operator[]
                           (&this->m_codecInfo,(long)minDts._4_4_);
        (*(pvVar7->m_streamReader->super_BaseAbstractStreamReader)._vptr_BaseAbstractStreamReader[7]
        )(pvVar7->m_streamReader,avPacket);
        pvVar7 = std::vector<StreamInfo,_std::allocator<StreamInfo>_>::operator[]
                           (&this->m_codecInfo,(long)minDts._4_4_);
        pvVar7->m_flushed = true;
      }
      updateReport(this,true);
      return 0;
    }
    if ((this->m_flushDataMode & 1U) != 0) {
      updateReport(this,false);
      this->m_lastReadRez = 1;
      return 1;
    }
    this->m_flushDataMode = true;
  } while( true );
}

Assistant:

int METADemuxer::readPacket(AVPacket& avPacket)

{
    avPacket.stream_index = 0;
    avPacket.data = nullptr;
    avPacket.size = 0;
    avPacket.codec = nullptr;
    m_lastReadRez = 0;
    while (true)
    {
        int minDtsIndex = -1;
        int64_t minDts = LLONG_MAX;
        bool allDataDelayed = true;
        while (allDataDelayed)
        {
            for (int i = 0; i < static_cast<int>(m_codecInfo.size()); i++)
            {
                StreamInfo& streamInfo = m_codecInfo[i];
                if (!m_flushDataMode)
                {
                    streamInfo.lastReadRez = streamInfo.read();
                    if (streamInfo.lastReadRez == BufferedFileReader::DATA_DELAYED)
                        continue;  // skip stream
                    allDataDelayed = false;
                    if (streamInfo.lastReadRez == BufferedFileReader::DATA_NOT_READY)
                    {
                        m_lastReadRez = BufferedFileReader::DATA_NOT_READY;
                        return BufferedFileReader::DATA_NOT_READY;
                    }
                    if (streamInfo.lastReadRez != BufferedFileReader::DATA_EOF2)
                    {
                        if (streamInfo.m_lastDTS < minDts)
                        {
                            minDtsIndex = i;
                            minDts = streamInfo.m_lastDTS;
                        }
                    }
                    else if (streamInfo.m_lastDTS < minDts && !streamInfo.m_flushed)
                    {
                        minDtsIndex = i;
                        minDts = streamInfo.m_lastDTS;
                    }
                }
                else
                {
                    allDataDelayed = false;
                    if (streamInfo.m_lastDTS < minDts && !streamInfo.m_flushed)
                    {
                        minDtsIndex = i;
                        minDts = streamInfo.m_lastDTS;
                    }
                }
            }
            if (allDataDelayed)
                for (const StreamInfo& si : m_codecInfo)
                {
                    const auto cReader = dynamic_cast<ContainerToReaderWrapper*>(si.m_dataReader);
                    if (cReader)
                        cReader->resetDelayedMark();
                }
        }
        if (minDtsIndex != -1)
        {
            if (!m_flushDataMode)
            {
                if (m_codecInfo[minDtsIndex].lastReadRez != BufferedFileReader::DATA_EOF2)
                {
                    const int res = m_codecInfo[minDtsIndex].m_streamReader->readPacket(avPacket);
                    m_codecInfo[minDtsIndex].m_lastAVRez = res;
                }
                else
                {
                    // flush single stream
                    m_codecInfo[minDtsIndex].m_streamReader->flushPacket(avPacket);
                    m_codecInfo[minDtsIndex].m_flushed = true;
                }
                // add time shift from external sync source
                // add static time shift
                avPacket.dts += m_codecInfo[minDtsIndex].m_timeShift;
                avPacket.pts += m_codecInfo[minDtsIndex].m_timeShift;
                m_codecInfo[minDtsIndex].m_lastDTS = avPacket.dts + avPacket.duration;
            }
            else
            {  // flush all streams
                m_codecInfo[minDtsIndex].m_streamReader->flushPacket(avPacket);
                m_codecInfo[minDtsIndex].m_flushed = true;
            }
            updateReport(true);
            return 0;
        }
        if (!m_flushDataMode)
            m_flushDataMode = true;
        else
        {
            updateReport(false);
            m_lastReadRez = BufferedFileReader::DATA_EOF;
            return BufferedReader::DATA_EOF;
        }
    }
}